

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O2

void ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint compressed_length)

{
  bool bVar1;
  byte value;
  byte bVar2;
  uint uVar3;
  uint count;
  uint distance;
  uint first_byte;
  pos_type pVar4;
  pos_type pVar5;
  pos_type pVar6;
  BitField<decltype(input)> descriptor_bits;
  int local_58;
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  local_48;
  
  pVar4 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::Tell(&input->
                  super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                );
  pVar5 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
          ::Tell(&output->
                  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                );
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader(&local_48,input);
  while( true ) {
    pVar6 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::Tell(&input->
                    super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  );
    if ((long)(ulong)compressed_length <= pVar6._M_off - pVar4._M_off) break;
    bVar1 = BitField::
            Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)0,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            ::Pop(&local_48);
    value = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::ReadImplementation
                      (&input->
                        super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      );
    if (bVar1) {
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
      WriteImplementation(output,value);
    }
    else {
      bVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::ReadImplementation
                        (&input->
                          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        );
      count = (bVar2 & 0xf) + 3;
      pVar6 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
              ::Tell(&output->
                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                    );
      local_58 = (int)pVar5._M_off;
      uVar3 = (int)pVar6._M_off - local_58;
      distance = (uVar3 - ((bVar2 & 0xf0) << 4 | (uint)value)) + 0xfee & 0xfff;
      if (uVar3 < distance) {
        OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
        ::Fill((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                *)output,'\0',count);
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
        Copy(output,distance,count);
      }
    }
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, const unsigned int compressed_length)
			{
				const auto input_start_position = input.Tell();
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (input.Distance(input_start_position) < compressed_length)
				{
					if (descriptor_bits.Pop())
					{
						// Uncompressed.
						output.Write(input.Read());
					}
					else
					{
						// Dictionary match.
						const unsigned int first_byte = input.Read();
						const unsigned int second_byte = input.Read();
						const unsigned int dictionary_index = (first_byte | ((second_byte << 4) & 0xF00)) + (0xF + 3);
						const unsigned int count = (second_byte & 0xF) + 3;
						const unsigned int output_position = output.Distance(output_start_position);
						const unsigned int distance = (output_position - dictionary_index) % 0x1000;

						if (distance > output_position)
						{
							// Zero-fill.
							output.Fill(0, count);
						}
						else
						{
							// Copy.
							output.Copy(distance, count);
						}
					}
				}
			}